

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O2

void __thiscall
gl4cts::DirectStateAccess::Renderbuffers::StorageMultisampleTest::Clean
          (StorageMultisampleTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar3;
  GLuint *pGVar4;
  bool bVar5;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  pGVar4 = this->m_rbo;
  lVar3 = 2;
  while (bVar5 = lVar3 != 0, lVar3 = lVar3 + -1, bVar5) {
    if (*pGVar4 != 0) {
      (**(code **)(lVar2 + 0x460))(1,pGVar4);
      *pGVar4 = 0;
    }
    if (pGVar4[-2] != 0) {
      (**(code **)(lVar2 + 0x440))(1,pGVar4 + -2);
      pGVar4[-2] = 0;
    }
    pGVar4 = pGVar4 + 1;
  }
  (**(code **)(lVar2 + 0x1c0))(0,0,0,0);
  (**(code **)(lVar2 + 0x1c8))(0x3ff0000000000000);
  (**(code **)(lVar2 + 0x208))(0);
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void StorageMultisampleTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Release objects. */
	for (glw::GLuint i = 0; i < 2; ++i)
	{
		if (m_rbo[i])
		{
			gl.deleteRenderbuffers(1, &m_rbo[i]);

			m_rbo[i] = 0;
		}

		if (m_fbo[i])
		{
			gl.deleteFramebuffers(1, &m_fbo[i]);

			m_fbo[i] = 0;
		}
	}

	/* Returning to default clear values. */
	gl.clearColor(0.f, 0.f, 0.f, 0.f);
	gl.clearDepth(1.f);
	gl.clearStencil(0);

	/* Errors clean up. */
	while (gl.getError())
		;
}